

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_hash_set_unittests.cc
# Opt level: O3

void __thiscall
DenseHashSet_TestEmplaceHint_Test::~DenseHashSet_TestEmplaceHint_Test
          (DenseHashSet_TestEmplaceHint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DenseHashSet, TestEmplaceHint) {
	dense_hash_set<const char *> set;
	set.set_empty_key(nullptr);

	const char * str1 = "Hello";
	const char * str2 = "World";

	set.insert(str1);
	auto it = set.begin();
	set.emplace_hint(it, str2);

	ASSERT_EQ(set.size(), 2ul);
}